

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

void __thiscall
Assimp::FBXExporter::WriteModelNodes
          (FBXExporter *this,StreamWriterLE *outstream,aiNode *node,int64_t parent_uid,
          unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
          *limbnodes,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          *transform_chain)

{
  _Rb_tree_header *p_Var1;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 uVar3;
  bool bVar4;
  aiNode *paVar5;
  int64_t iVar6;
  StreamWriterLE *pSVar7;
  vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *this_01;
  long lVar8;
  const_iterator cVar9;
  _Base_ptr p_Var10;
  mapped_type_conflict2 *pmVar11;
  runtime_error *prVar12;
  const_iterator cVar13;
  ostream *poVar14;
  _Base_ptr p_Var15;
  FBXExporter *pFVar16;
  aiVector3t<float> *pScaling;
  ulong uVar17;
  aiNode *node_local;
  int64_t node_uid;
  float local_330;
  StreamWriterLE *local_328;
  FBXExporter *local_320;
  ulong local_318;
  int64_t node_attribute_uid;
  long local_308;
  long local_300 [2];
  undefined1 local_2f0 [8];
  float local_2e8;
  undefined4 uStack_2e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Hashtable<const_aiNode_*,_const_aiNode_*,_std::allocator<const_aiNode_*>,_std::__detail::_Identity,_std::equal_to<const_aiNode_*>,_std::hash<const_aiNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2d0;
  string type_name;
  vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_> local_2a8;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> vStack_290;
  bool local_278;
  int64_t new_node_uid;
  float local_250;
  int64_t parent_uid_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *local_200;
  string node_name;
  FBXExportProperty local_1d8;
  stringstream err;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_> local_198;
  vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_> vStack_180;
  bool local_168;
  
  node_local = node;
  local_2d0 = &limbnodes->_M_h;
  parent_uid_local = parent_uid;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_name,(node->mName).data,(allocator<char> *)&err);
  lVar8 = std::__cxx11::string::find((char *)&node_name,FBX::MAGIC_NODE_TAG_abi_cxx11_,0);
  local_328 = outstream;
  if (lVar8 == -1) {
    node_uid = 0;
    if (this->mScene->mRootNode != node) {
      p_Var15 = (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var15 == (_Base_ptr)0x0) {
LAB_0033e8ef:
        lVar8 = this->last_uid + 1;
        this->last_uid = lVar8;
        node_uid = lVar8;
        pmVar11 = std::
                  map<const_aiNode_*,_long,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_long>_>_>
                  ::operator[](&this->node_uids,&node_local);
        *pmVar11 = lVar8;
      }
      else {
        p_Var1 = &(this->node_uids)._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = &p_Var1->_M_header;
        do {
          if (*(aiNode **)(p_Var15 + 1) >= node) {
            p_Var10 = p_Var15;
          }
          p_Var15 = (&p_Var15->_M_left)[*(aiNode **)(p_Var15 + 1) < node];
        } while (p_Var15 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 == p_Var1) || (node < *(aiNode **)(p_Var10 + 1)))
        goto LAB_0033e8ef;
        node_uid = (int64_t)p_Var10[1]._M_parent;
      }
      this_00 = &this->connections;
      std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
      emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)this_00,
                 (char (*) [2])0x6b5a7d,(char (*) [3])"OO",&node_uid,&parent_uid_local);
      if (node_local != this->mScene->mRootNode) {
        if (node_local->mNumMeshes == 1) {
          std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
          emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                    ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)this_00,
                     (char (*) [2])0x6b5a7d,(char (*) [3])"OO",
                     (this->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + *node_local->mMeshes,&node_uid);
          std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
          emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                    ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)this_00,
                     (char (*) [2])0x6b5a7d,(char (*) [3])"OO",
                     (this->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     this->mScene->mMeshes[*node_local->mMeshes]->mMaterialIndex,&node_uid);
          iVar6 = node_uid;
          paVar5 = node_local;
          bVar4 = this->binary;
          pFVar16 = (FBXExporter *)&err;
          _err = (pointer)&local_1a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)pFVar16,"Mesh","");
          WriteModelNode(pFVar16,local_328,bVar4,paVar5,iVar6,(string *)&err,transform_chain,
                         TransformInheritance_RSrs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_err != &local_1a8) goto LAB_0033ea30;
        }
        else {
          cVar13 = std::
                   _Hashtable<const_aiNode_*,_const_aiNode_*,_std::allocator<const_aiNode_*>,_std::__detail::_Identity,_std::equal_to<const_aiNode_*>,_std::hash<const_aiNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_2d0,&node_local);
          iVar6 = node_uid;
          paVar5 = node_local;
          bVar4 = this->binary;
          if (cVar13.super__Node_iterator_base<const_aiNode_*,_false>._M_cur == (__node_type *)0x0)
          {
            pFVar16 = (FBXExporter *)&err;
            _err = (pointer)&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)pFVar16,"Null","");
            WriteModelNode(pFVar16,local_328,bVar4,paVar5,iVar6,(string *)&err,transform_chain,
                           TransformInheritance_RSrs);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_err != &local_1a8) goto LAB_0033ea30;
          }
          else {
            _err = (pointer)&local_1a8;
            pFVar16 = (FBXExporter *)&err;
            std::__cxx11::string::_M_construct<char_const*>((string *)pFVar16,"LimbNode","");
            pSVar7 = local_328;
            WriteModelNode(pFVar16,local_328,bVar4,paVar5,iVar6,(string *)&err,transform_chain,
                           TransformInheritance_RSrs);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_err != &local_1a8) {
              operator_delete(_err,local_1a8._M_allocated_capacity + 1);
            }
            node_attribute_uid = this->last_uid + 1;
            this->last_uid = node_attribute_uid;
            paVar2 = &type_name.field_2;
            type_name._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&type_name,"NodeAttribute","")
            ;
            _err = (pointer)&local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&err,type_name._M_dataplus._M_p,
                       type_name._M_dataplus._M_p + type_name._M_string_length);
            vStack_180.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_180.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_198.
            super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_180.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_198.
            super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_198.
            super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_168 = false;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)type_name._M_dataplus._M_p != paVar2) {
              operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1
                             );
            }
            iVar6 = node_attribute_uid;
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__str,FBX::SEPARATOR_abi_cxx11_,
                       DAT_008dd668 + FBX::SEPARATOR_abi_cxx11_);
            std::__cxx11::string::append((char *)&__str);
            FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
                      ((Node *)&err,iVar6,&__str,"LimbNode");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            type_name._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&type_name,"TypeFlags","");
            FBX::FBXExportProperty::FBXExportProperty(&local_1d8,"Skeleton",false);
            FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>((Node *)&err,&type_name,&local_1d8);
            if (local_1d8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1d8.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1d8.data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1d8.data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)type_name._M_dataplus._M_p != paVar2) {
              operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1
                             );
            }
            FBX::Node::Dump((Node *)&err,pSVar7,this->binary,1);
            std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
            emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                      ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)this_00,
                       (char (*) [2])0x6b5a7d,(char (*) [3])"OO",&node_attribute_uid,&node_uid);
            std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&vStack_180)
            ;
            std::
            vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
            ::~vector(&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_err != &local_1a8) {
LAB_0033ea30:
              operator_delete(_err,local_1a8._M_allocated_capacity + 1);
            }
          }
        }
      }
    }
    local_320 = this;
    if ((1 < node_local->mNumMeshes) ||
       (node_local->mNumMeshes != 0 && node_local == this->mScene->mRootNode)) {
      local_200 = (vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections;
      paVar2 = &type_name.field_2;
      local_318 = 0;
      do {
        this_01 = local_200;
        pFVar16 = local_320;
        new_node_uid = local_320->last_uid + 1;
        local_320->last_uid = new_node_uid;
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  (local_200,(char (*) [2])0x6b5a7d,(char (*) [3])"OO",&new_node_uid,&node_uid);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  (this_01,(char (*) [2])0x6b5a7d,(char (*) [3])"OO",
                   (pFVar16->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + node_local->mMeshes[local_318],&new_node_uid);
        std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
        emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
                  (this_01,(char (*) [2])0x6b5a7d,(char (*) [3])"OO",
                   (pFVar16->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   pFVar16->mScene->mMeshes[node_local->mMeshes[local_318]]->mMaterialIndex,
                   &new_node_uid);
        type_name._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&type_name,"Model","");
        _err = (pointer)&local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&err,type_name._M_dataplus._M_p,
                   type_name._M_dataplus._M_p + type_name._M_string_length);
        vStack_180.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_180.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_198.
        super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_180.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168 = false;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != paVar2) {
          operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&node_attribute_uid,
                   (local_320->mScene->mMeshes[node_local->mMeshes[local_318]]->mName).data,
                   (allocator<char> *)&type_name);
        type_name._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&type_name,FBX::SEPARATOR_abi_cxx11_,
                   DAT_008dd668 + FBX::SEPARATOR_abi_cxx11_);
        std::__cxx11::string::append((char *)&type_name);
        std::__cxx11::string::_M_append
                  ((char *)&node_attribute_uid,(ulong)type_name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != paVar2) {
          operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1);
        }
        iVar6 = new_node_uid;
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,node_attribute_uid,local_308 + node_attribute_uid);
        FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
                  ((Node *)&err,iVar6,&local_220,"Mesh");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        type_name._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&type_name,"Version","");
        FBX::Node::AddChild<int>((Node *)&err,&type_name,0xe8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != paVar2) {
          operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1);
        }
        local_2f0 = (undefined1  [8])&local_2e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Properties70","");
        type_name._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&type_name,local_2f0,
                   (char *)((long)local_2f0 + CONCAT44(uStack_2e4,local_2e8)));
        vStack_290.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_290.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.
        super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_290.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.
        super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.
        super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_278 = false;
        if (local_2f0 != (undefined1  [8])&local_2e0) {
          operator_delete((void *)local_2f0,local_2e0._M_allocated_capacity + 1);
        }
        local_2f0 = (undefined1  [8])&local_2e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"InheritType","");
        FBX::Node::AddP70enum((Node *)&type_name,(string *)local_2f0,1);
        if (local_2f0 != (undefined1  [8])&local_2e0) {
          operator_delete((void *)local_2f0,local_2e0._M_allocated_capacity + 1);
        }
        std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
                  (&vStack_180,(Node *)&type_name);
        FBX::Node::Dump((Node *)&err,local_328,local_320->binary,1);
        std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&vStack_290);
        std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ::~vector(&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != paVar2) {
          operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1);
        }
        if ((long *)node_attribute_uid != local_300) {
          operator_delete((void *)node_attribute_uid,local_300[0] + 1);
        }
        std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&vStack_180);
        std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
        ::~vector(&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_err != &local_1a8) {
          operator_delete(_err,local_1a8._M_allocated_capacity + 1);
        }
        local_318 = local_318 + 1;
      } while (local_318 < node_local->mNumMeshes);
    }
    pFVar16 = local_320;
    pSVar7 = local_328;
    if (node_local->mNumChildren != 0) {
      uVar17 = 0;
      do {
        WriteModelNodes(pFVar16,pSVar7,node_local->mChildren[uVar17],node_uid,
                        (unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
                         *)local_2d0);
        uVar17 = uVar17 + 1;
      } while (uVar17 < node_local->mNumChildren);
    }
    goto LAB_0033f07e;
  }
  std::__cxx11::string::find((char *)&node_name,FBX::MAGIC_NODE_TAG_abi_cxx11_,0);
  std::__cxx11::string::substr((ulong)&type_name,(ulong)&node_name);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
          ::find(&transform_types_abi_cxx11_._M_t,&type_name);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &transform_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&err);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_local_buf,"unrecognized FBX transformation node",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_local_buf," of type ",9);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8._M_local_buf,type_name._M_dataplus._M_p,
                         type_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," in node ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,node_name._M_dataplus._M_p,node_name._M_string_length);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,(string *)&node_attribute_uid);
    *(undefined ***)prVar12 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2f0 = (undefined1  [8])0x0;
  local_2e8 = 0.0;
  node_uid = 0;
  local_330 = 0.0;
  pScaling = (aiVector3t<float> *)&new_node_uid;
  new_node_uid = 0;
  local_250 = 0.0;
  aiMatrix4x4t<float>::Decompose
            (&node_local->mTransformation,pScaling,(aiVector3t<float> *)&node_uid,
             (aiVector3t<float> *)local_2f0);
  uVar3 = (undefined1)cVar9._M_node[3]._M_color;
  if ((byte)uVar3 < 0x73) {
    if (uVar3 != 0x69) {
      if (uVar3 != 0x72) goto LAB_0033ef62;
      node_uid = CONCAT44((float)((ulong)node_uid >> 0x20) * 57.29578,(float)node_uid * 57.29578);
      local_330 = local_330 * 57.29578;
      pScaling = (aiVector3t<float> *)&node_uid;
      goto LAB_0033effc;
    }
  }
  else {
    if ((uVar3 != 0x73) && (pScaling = (aiVector3t<float> *)local_2f0, uVar3 != 0x74)) {
LAB_0033ef62:
      std::__cxx11::stringstream::stringstream((stringstream *)&err);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8._M_local_buf,"unrecognized FBX transformation type code: ",
                 0x2b);
      node_attribute_uid = CONCAT71(node_attribute_uid._1_7_,(char)cVar9._M_node[3]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8._M_local_buf,(char *)&node_attribute_uid,1);
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar12,(string *)&node_attribute_uid);
      *(undefined ***)prVar12 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_0033effc:
    std::
    vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
    ::emplace_back<std::__cxx11::string_const&,aiVector3t<float>&>
              ((vector<std::pair<std::__cxx11::string,aiVector3t<float>>,std::allocator<std::pair<std::__cxx11::string,aiVector3t<float>>>>
                *)transform_chain,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (cVar9._M_node + 1),pScaling);
  }
  pSVar7 = local_328;
  if (node_local->mNumChildren != 0) {
    uVar17 = 0;
    do {
      WriteModelNodes(this,pSVar7,node_local->mChildren[uVar17],parent_uid_local,
                      (unordered_set<const_aiNode_*,_std::hash<const_aiNode_*>,_std::equal_to<const_aiNode_*>,_std::allocator<const_aiNode_*>_>
                       *)local_2d0,transform_chain);
      uVar17 = uVar17 + 1;
    } while (uVar17 < node_local->mNumChildren);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)type_name._M_dataplus._M_p != &type_name.field_2) {
    operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1);
  }
LAB_0033f07e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)node_name._M_dataplus._M_p != &node_name.field_2) {
    operator_delete(node_name._M_dataplus._M_p,node_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXExporter::WriteModelNodes(
    StreamWriterLE& outstream,
    const aiNode* node,
    int64_t parent_uid,
    const std::unordered_set<const aiNode*>& limbnodes,
    std::vector<std::pair<std::string,aiVector3D>>& transform_chain
) {
    // first collapse any expanded transformation chains created by FBX import.
    std::string node_name(node->mName.C_Str());
    if (node_name.find(MAGIC_NODE_TAG) != std::string::npos) {
        auto pos = node_name.find(MAGIC_NODE_TAG) + MAGIC_NODE_TAG.size() + 1;
        std::string type_name = node_name.substr(pos);
        auto elem = transform_types.find(type_name);
        if (elem == transform_types.end()) {
            // then this is a bug and should be fixed
            std::stringstream err;
            err << "unrecognized FBX transformation node";
            err << " of type " << type_name << " in node " << node_name;
            throw DeadlyExportError(err.str());
        }
        aiVector3D t, r, s;
        node->mTransformation.Decompose(s, r, t);
        switch (elem->second.second) {
        case 'i': // inverse
            // we don't need to worry about the inverse matrices
            break;
        case 't': // translation
            transform_chain.emplace_back(elem->first, t);
            break;
        case 'r': // rotation
            r *= float(DEG);
            transform_chain.emplace_back(elem->first, r);
            break;
        case 's': // scale
            transform_chain.emplace_back(elem->first, s);
            break;
        default:
            // this should never happen
            std::stringstream err;
            err << "unrecognized FBX transformation type code: ";
            err << elem->second.second;
            throw DeadlyExportError(err.str());
        }
        // now continue on to any child nodes
        for (unsigned i = 0; i < node->mNumChildren; ++i) {
            WriteModelNodes(
                outstream,
                node->mChildren[i],
                parent_uid,
                limbnodes,
                transform_chain
            );
        }
        return;
    }

    int64_t node_uid = 0;
    // generate uid and connect to parent, if not the root node,
    if (node != mScene->mRootNode) {
        auto elem = node_uids.find(node);
        if (elem != node_uids.end()) {
            node_uid = elem->second;
        } else {
            node_uid = generate_uid();
            node_uids[node] = node_uid;
        }
        connections.emplace_back("C", "OO", node_uid, parent_uid);
    }

    // what type of node is this?
    if (node == mScene->mRootNode) {
        // handled later
    } else if (node->mNumMeshes == 1) {
        // connect to child mesh, which should have been written previously
        connections.emplace_back(
            "C", "OO", mesh_uids[node->mMeshes[0]], node_uid
        );
        // also connect to the material for the child mesh
        connections.emplace_back(
            "C", "OO",
            material_uids[mScene->mMeshes[node->mMeshes[0]]->mMaterialIndex],
            node_uid
        );
        // write model node
        WriteModelNode(
            outstream, binary, node, node_uid, "Mesh", transform_chain
        );
    } else if (limbnodes.count(node)) {
        WriteModelNode(
            outstream, binary, node, node_uid, "LimbNode", transform_chain
        );
        // we also need to write a nodeattribute to mark it as a skeleton
        int64_t node_attribute_uid = generate_uid();
        FBX::Node na("NodeAttribute");
        na.AddProperties(
            node_attribute_uid, FBX::SEPARATOR + "NodeAttribute", "LimbNode"
        );
        na.AddChild("TypeFlags", FBXExportProperty("Skeleton"));
        na.Dump(outstream, binary, 1);
        // and connect them
        connections.emplace_back("C", "OO", node_attribute_uid, node_uid);
    } else {
        // generate a null node so we can add children to it
        WriteModelNode(
            outstream, binary, node, node_uid, "Null", transform_chain
        );
    }

    // if more than one child mesh, make nodes for each mesh
    if (node->mNumMeshes > 1 || node == mScene->mRootNode) {
        for (size_t i = 0; i < node->mNumMeshes; ++i) {
            // make a new model node
            int64_t new_node_uid = generate_uid();
            // connect to parent node
            connections.emplace_back("C", "OO", new_node_uid, node_uid);
            // connect to child mesh, which should have been written previously
            connections.emplace_back(
                "C", "OO", mesh_uids[node->mMeshes[i]], new_node_uid
            );
            // also connect to the material for the child mesh
            connections.emplace_back(
                "C", "OO",
                material_uids[
                    mScene->mMeshes[node->mMeshes[i]]->mMaterialIndex
                ],
                new_node_uid
            );
            // write model node
            FBX::Node m("Model");
            // take name from mesh name, if it exists
            std::string name = mScene->mMeshes[node->mMeshes[i]]->mName.C_Str();
            name += FBX::SEPARATOR + "Model";
            m.AddProperties(new_node_uid, name, "Mesh");
            m.AddChild("Version", int32_t(232));
            FBX::Node p("Properties70");
            p.AddP70enum("InheritType", 1);
            m.AddChild(p);
            m.Dump(outstream, binary, 1);
        }
    }

    // now recurse into children
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        WriteModelNodes(
            outstream, node->mChildren[i], node_uid, limbnodes
        );
    }
}